

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O2

bool __thiscall cmUVProcessChain::Wait(cmUVProcessChain *this,uint64_t milliseconds)

{
  _Head_base<0UL,_cmUVProcessChain::InternalData_*,_false> _Var1;
  bool timeout;
  uv_timer_ptr timer;
  
  timer.super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.handle.
  super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  timer.super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.handle.
  super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (milliseconds != 0) {
    ::cm::uv_timer_ptr::init
              (&timer,(EVP_PKEY_CTX *)
                      ((this->Data)._M_t.
                       super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
                       .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false>._M_head_impl)
                      ->Loop);
    ::cm::uv_timer_ptr::start(&timer,Wait::anon_class_1_0_00000001::__invoke,milliseconds,0);
  }
  while (_Var1._M_head_impl =
              (this->Data)._M_t.
              super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
              ._M_t.
              super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
              .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false>._M_head_impl,
        (ulong)(_Var1._M_head_impl)->ProcessesCompleted <
        (ulong)((long)*(pointer *)((long)&(_Var1._M_head_impl)->Processes + 8) -
                *(long *)&((_Var1._M_head_impl)->Processes).
                          super__Vector_base<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>,_std::allocator<std::unique_ptr<cmUVProcessChain::InternalData::ProcessData,_std::default_delete<cmUVProcessChain::InternalData::ProcessData>_>_>_>
               >> 3)) {
    uv_run((_Var1._M_head_impl)->Loop,UV_RUN_ONCE);
  }
  ::cm::uv_handle_ptr_base_<uv_timer_s>::~uv_handle_ptr_base_
            ((uv_handle_ptr_base_<uv_timer_s> *)&timer);
  return true;
}

Assistant:

bool cmUVProcessChain::Wait(uint64_t milliseconds)
{
  bool timeout = false;
  cm::uv_timer_ptr timer;

  if (milliseconds > 0) {
    timer.init(*this->Data->Loop, &timeout);
    timer.start(
      [](uv_timer_t* handle) {
        auto* timeoutPtr = static_cast<bool*>(handle->data);
        *timeoutPtr = true;
      },
      milliseconds, 0);
  }

  while (!timeout &&
         this->Data->ProcessesCompleted < this->Data->Processes.size()) {
    uv_run(this->Data->Loop, UV_RUN_ONCE);
  }

  return !timeout;
}